

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta.cpp
# Opt level: O2

QString * QMakeMetaInfo::checkLib(QString *__return_storage_ptr__,QString *lib)

{
  char cVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_68;
  QArrayDataPointer<char> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  cVar1 = QFile::exists((QString *)lib);
  if (cVar1 == '\0') {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
LAB_0020b8dc:
    if (Option::debug_level == 0) goto LAB_0020b921;
    QString::toLatin1_helper((QString *)&local_50);
    if (local_50.ptr == (char *)0x0) {
      local_50.ptr = (char *)&QByteArray::_empty;
    }
    debug_msg_internal(2,"QMakeMetaInfo: Cannot find info file for %s",local_50.ptr);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&lib->d);
    if ((__return_storage_ptr__->d).ptr == (char16_t *)0x0) goto LAB_0020b8dc;
    if (Option::debug_level == 0) goto LAB_0020b921;
    QString::toLatin1_helper((QString *)&local_50);
    if (local_50.ptr == (char *)0x0) {
      local_50.ptr = (char *)&QByteArray::_empty;
    }
    QString::toLatin1_helper((QString *)&QStack_68);
    if (QStack_68.ptr == (char *)0x0) {
      QStack_68.ptr = (char *)&QByteArray::_empty;
    }
    debug_msg_internal(2,"QMakeMetaInfo: Found info file %s for %s",local_50.ptr,QStack_68.ptr);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_68);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
LAB_0020b921:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString
QMakeMetaInfo::checkLib(const QString &lib)
{
    QString ret = QFile::exists(lib) ? lib : QString();
    if(ret.isNull()) {
        debug_msg(2, "QMakeMetaInfo: Cannot find info file for %s", lib.toLatin1().constData());
    } else {
        debug_msg(2, "QMakeMetaInfo: Found info file %s for %s", ret.toLatin1().constData(), lib.toLatin1().constData());
    }
    return ret;
}